

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool ClipperLib::Orientation(OutRec *outRec,bool UseFullInt64Range)

{
  long lVar1;
  OutPt *pOVar2;
  ulong uVar3;
  OutPt *pOVar4;
  OutPt *pOVar5;
  long lVar6;
  bool bVar7;
  Int128 local_68;
  Int128 local_58;
  long local_48;
  long local_40;
  Int128 local_38;
  Int128 local_28;
  
  pOVar4 = outRec->pts;
  if (pOVar4 == (OutPt *)0x0) {
    return false;
  }
  pOVar2 = pOVar4;
  for (pOVar5 = pOVar4->next; pOVar5 != pOVar4; pOVar5 = pOVar5->next) {
    lVar6 = (pOVar2->pt).Y;
    lVar1 = (pOVar5->pt).Y;
    if ((lVar6 <= lVar1) && ((lVar6 < lVar1 || ((pOVar5->pt).X < (pOVar2->pt).X)))) {
      pOVar2 = pOVar5;
    }
  }
  outRec->bottomPt = pOVar2;
  pOVar2->idx = outRec->idx;
  pOVar4 = pOVar2->next;
  lVar6 = (pOVar2->pt).X;
  lVar1 = (pOVar2->pt).Y;
  pOVar5 = pOVar2;
  do {
    pOVar5 = pOVar5->prev;
    if ((pOVar2 == pOVar5) || (lVar6 != (pOVar5->pt).X)) break;
  } while (lVar1 == (pOVar5->pt).Y);
  for (; ((pOVar2 != pOVar4 && (lVar6 == (pOVar4->pt).X)) && (lVar1 == (pOVar4->pt).Y));
      pOVar4 = pOVar4->next) {
  }
  local_38.lo = lVar6 - (pOVar5->pt).X;
  lVar6 = (pOVar4->pt).X - lVar6;
  local_40 = (pOVar4->pt).Y - lVar1;
  if (UseFullInt64Range) {
    local_38.hi = local_38.lo >> 0x3f;
    local_48 = local_40 >> 0x3f;
    Int128::operator*(&local_28,&local_38);
    local_68.hi = lVar6 >> 0x3f;
    local_68.lo = lVar6;
    Int128::operator*(&local_58,&local_68);
    uVar3 = ~local_58.hi;
    if (local_58.lo == 0) {
      uVar3 = -local_58.hi;
    }
    uVar3 = uVar3 + local_28.hi + (ulong)((ulong)(local_28.lo - local_58.lo) < (ulong)-local_58.lo);
    if (uVar3 == 0) {
      uVar3 = local_28.lo - local_58.lo;
    }
    bVar7 = -1 < (long)uVar3;
  }
  else {
    bVar7 = lVar6 * (lVar1 - (pOVar5->pt).Y) <= local_40 * local_38.lo;
  }
  return bVar7;
}

Assistant:

bool Orientation(OutRec *outRec, bool UseFullInt64Range)
{
  if (!outRec->pts)
    return 0.0;

  //first make sure bottomPt is correctly assigned ...
  OutPt *opBottom = outRec->pts, *op = outRec->pts->next;
  while (op != outRec->pts)
  {
    if (op->pt.Y >= opBottom->pt.Y)
    {
      if (op->pt.Y > opBottom->pt.Y || op->pt.X < opBottom->pt.X)
      opBottom = op;
    }
    op = op->next;
  }
  outRec->bottomPt = opBottom;
  opBottom->idx = outRec->idx;

  op = opBottom;
  //find vertices either side of bottomPt (skipping duplicate points) ....
  OutPt *opPrev = op->prev;
  OutPt *opNext = op->next;
  while (op != opPrev && PointsEqual(op->pt, opPrev->pt))
    opPrev = opPrev->prev;
  while (op != opNext && PointsEqual(op->pt, opNext->pt))
    opNext = opNext->next;

  IntPoint ip1, ip2;
  ip1.X = op->pt.X - opPrev->pt.X;
  ip1.Y = op->pt.Y - opPrev->pt.Y;
  ip2.X = opNext->pt.X - op->pt.X;
  ip2.Y = opNext->pt.Y - op->pt.Y;

  if (UseFullInt64Range)
    return Int128(ip1.X) * Int128(ip2.Y) - Int128(ip2.X) * Int128(ip1.Y) >= 0;
  else
    return (ip1.X * ip2.Y - ip2.X * ip1.Y) >= 0;
}